

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomUpEvaluation.hpp
# Opt level: O0

tuple<std::tuple<>,_Lib::ReturnNone<std::tuple<>_>,_Lib::Memo::None<Kernel::AutoDerefTermSpec,_std::tuple<>_>,_std::tuple<>,_std::tuple<>_>
* __thiscall
Lib::
BottomUpEvaluation<Kernel::AutoDerefTermSpec,_std::tuple<>,_std::tuple<>,_Lib::ReturnNone<std::tuple<>_>,_Lib::Memo::None<Kernel::AutoDerefTermSpec,_std::tuple<>_>,_std::tuple<>_>
::intoTuple(BottomUpEvaluation<Kernel::AutoDerefTermSpec,_std::tuple<>,_std::tuple<>,_Lib::ReturnNone<std::tuple<>_>,_Lib::Memo::None<Kernel::AutoDerefTermSpec,_std::tuple<>_>,_std::tuple<>_>
            *this)

{
  tuple<> *in_RSI;
  tuple<> *in_RDI;
  tuple<> *__elements_2;
  ReturnNone<std::tuple<>_> *in_stack_ffffffffffffffe0;
  tuple<> *in_stack_ffffffffffffffe8;
  tuple<> *this_00;
  
  __elements_2 = in_RDI;
  this_00 = in_RSI;
  move_if_value<std::tuple<>,_true>(in_RSI + 1);
  move_if_value<Lib::ReturnNone<std::tuple<>_>,_true>((ReturnNone<std::tuple<>_> *)(in_RSI + 2));
  move_if_value<Lib::Memo::None<Kernel::AutoDerefTermSpec,_std::tuple<>_>,_true>
            ((None<Kernel::AutoDerefTermSpec,_std::tuple<>_> *)(in_RSI + 3));
  move_if_value<std::tuple<>,_true>(in_RSI + 4);
  std::make_tuple<>();
  std::
  tuple<std::tuple<>,_Lib::ReturnNone<std::tuple<>_>,_Lib::Memo::None<Kernel::AutoDerefTermSpec,_std::tuple<>_>,_std::tuple<>,_std::tuple<>_>
  ::
  tuple<std::tuple<>,_Lib::ReturnNone<std::tuple<>_>,_Lib::Memo::None<Kernel::AutoDerefTermSpec,_std::tuple<>_>,_std::tuple<>,_std::tuple<>,_true,_true>
            ((tuple<std::tuple<>,_Lib::ReturnNone<std::tuple<>_>,_Lib::Memo::None<Kernel::AutoDerefTermSpec,_std::tuple<>_>,_std::tuple<>,_std::tuple<>_>
              *)this_00,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             (None<Kernel::AutoDerefTermSpec,_std::tuple<>_> *)__elements_2,in_RDI,in_RSI);
  return (tuple<std::tuple<>,_Lib::ReturnNone<std::tuple<>_>,_Lib::Memo::None<Kernel::AutoDerefTermSpec,_std::tuple<>_>,_std::tuple<>,_std::tuple<>_>
          *)(None<Kernel::AutoDerefTermSpec,_std::tuple<>_> *)__elements_2;
}

Assistant:

auto intoTuple() &&
  { return std::tuple<
#                                       define foreach(idx, Type, name, defaultVal)       \
             Type,
                                        FOR_FIELD(foreach)
#                                       undef foreach
             std::tuple<>
    >(
#                                       define foreach(idx, Type, name, defaultVal)       \
             move_if_value<Type>(_ ## name),
                                        FOR_FIELD(foreach)
#                                       undef foreach
             std::make_tuple()); }